

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O2

void qt_message_print(QtMsgType msgType,QMessageLogContext *context,QString *message)

{
  undefined1 *puVar1;
  bool bVar2;
  QLoggingCategory *this;
  code *pcVar3;
  QMessageLogContext *context_00;
  undefined1 auVar4 [16];
  
  context_00 = context;
  if ((((msgType != QtFatalMsg) && (bVar2 = isDefaultCategory(context->category), bVar2)) &&
      (this = QLoggingCategory::defaultCategory(), this != (QLoggingCategory *)0x0)) &&
     (context_00 = (QMessageLogContext *)(ulong)msgType,
     bVar2 = QLoggingCategory::isEnabled(this,msgType), !bVar2)) {
    return;
  }
  auVar4 = __tls_get_addr(&PTR_00674338);
  if (*(char *)(auVar4._0_8_ + 0x28) == '\0') {
    puVar1 = (undefined1 *)(auVar4._0_8_ + 0x28);
    *puVar1 = 1;
    pcVar3 = qDefaultMessageHandler;
    if (messageHandler._q_value._M_b._M_p != (__base_type)0x0) {
      pcVar3 = (code *)messageHandler;
    }
    (*pcVar3)((QMessageLogContext *)(ulong)msgType,context,message);
    *puVar1 = 0;
    return;
  }
  stderr_message_handler((QtMsgType)message,context_00,auVar4._8_8_);
  return;
}

Assistant:

static void qt_message_print(QtMsgType msgType, const QMessageLogContext &context, const QString &message)
{
    Q_TRACE(qt_message_print, msgType, context.category, context.function, context.file, context.line, message);

    // qDebug, qWarning, ... macros do not check whether category is enabledgc
    if (msgType != QtFatalMsg && isDefaultCategory(context.category)) {
        if (QLoggingCategory *defaultCategory = QLoggingCategory::defaultCategory()) {
            if (!defaultCategory->isEnabled(msgType))
                return;
        }
    }

    // prevent recursion in case the message handler generates messages
    // itself, e.g. by using Qt API
    if (grabMessageHandler()) {
        const auto ungrab = qScopeGuard([]{ ungrabMessageHandler(); });
        auto msgHandler = messageHandler.loadAcquire();
        (msgHandler ? msgHandler : qDefaultMessageHandler)(msgType, context, message);
    } else {
        stderr_message_handler(msgType, context, message);
    }
}